

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_buffer_method_reset(jit_State *J,RecordFFData *rd)

{
  ulong uVar1;
  IRRef1 IVar2;
  short sVar3;
  IRRef1 IVar4;
  TRef TVar5;
  TRef TVar6;
  TRef TVar7;
  TRef TVar8;
  TRef trb;
  TRef zerop;
  TRef zeropgc;
  TRef trcow;
  TRef trl;
  int iscow;
  SBufExt *sbx;
  TRef ud;
  RecordFFData *rd_local;
  jit_State *J_local;
  TRef fref_6;
  TRef fref_5;
  TRef fref_4;
  TRef fref_2;
  TRef fref_1;
  TRef fref;
  TRef fref_3;
  
  TVar5 = recff_sbufx_check(J,rd,0);
  uVar1 = *(ulong *)((rd->argv->u64 & 0x7fffffffffff) + 0x48);
  IVar2 = (IRRef1)TVar5;
  (J->fold).ins.field_0.ot = 0x4509;
  (J->fold).ins.field_0.op1 = IVar2;
  (J->fold).ins.field_0.op2 = 0x11;
  TVar5 = lj_opt_fold(J);
  TVar6 = lj_ir_kint64(J,2);
  (J->fold).ins.field_0.ot = 0x2115;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
  TVar6 = lj_opt_fold(J);
  TVar7 = lj_ir_kint64(J,0);
  sVar3 = 8;
  if ((uVar1 & 2) != 0) {
    sVar3 = 9;
  }
  (J->fold).ins.field_0.ot = sVar3 << 8 | 0x95;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
  lj_opt_fold(J);
  if ((uVar1 & 2) == 0) {
    (J->fold).ins.field_0.ot = 0x4509;
    (J->fold).ins.field_0.op1 = IVar2;
    (J->fold).ins.field_0.op2 = 0x10;
    TVar5 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x3e09;
    (J->fold).ins.field_0.op1 = IVar2;
    (J->fold).ins.field_0.op2 = 0xe;
    TVar6 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x4d09;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
    lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x3e09;
    (J->fold).ins.field_0.op1 = IVar2;
    (J->fold).ins.field_0.op2 = 0x13;
    TVar6 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x4d09;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
    lj_opt_fold(J);
  }
  else {
    TVar6 = lj_ir_kint64(J,0);
    TVar8 = lj_ir_kint64(J,2);
    (J->fold).ins.field_0.ot = 0x2315;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
    TVar5 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x3e09;
    (J->fold).ins.field_0.op1 = IVar2;
    (J->fold).ins.field_0.op2 = 0xe;
    TVar8 = lj_opt_fold(J);
    IVar4 = (IRRef1)TVar6;
    (J->fold).ins.field_0.ot = 0x4d09;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
    (J->fold).ins.field_0.op2 = IVar4;
    lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x3e09;
    (J->fold).ins.field_0.op1 = IVar2;
    (J->fold).ins.field_0.op2 = 0xf;
    TVar6 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x4d09;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
    (J->fold).ins.field_0.op2 = IVar4;
    lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x3e09;
    (J->fold).ins.field_0.op1 = IVar2;
    (J->fold).ins.field_0.op2 = 0x10;
    TVar6 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x4d09;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
    (J->fold).ins.field_0.op2 = IVar4;
    lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x3e09;
    (J->fold).ins.field_0.op1 = IVar2;
    (J->fold).ins.field_0.op2 = 0x11;
    TVar6 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x4d09;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
    lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x3e09;
    (J->fold).ins.field_0.op1 = IVar2;
    (J->fold).ins.field_0.op2 = 0x12;
    TVar5 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x4d09;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
    lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x3e09;
    (J->fold).ins.field_0.op1 = IVar2;
    (J->fold).ins.field_0.op2 = 0x13;
    TVar5 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x4d09;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
    (J->fold).ins.field_0.op2 = IVar4;
    lj_opt_fold(J);
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_buffer_method_reset(jit_State *J, RecordFFData *rd)
{
  TRef ud = recff_sbufx_check(J, rd, 0);
  SBufExt *sbx = bufV(&rd->argv[0]);
  int iscow = (int)sbufiscow(sbx);
  TRef trl = recff_sbufx_get_L(J, ud);
  TRef trcow = emitir(IRT(IR_BAND, IRT_IGC), trl, lj_ir_kintpgc(J, SBUF_FLAG_COW));
  TRef zeropgc = lj_ir_kintpgc(J, 0);
  emitir(IRTG(iscow ? IR_NE : IR_EQ, IRT_IGC), trcow, zeropgc);
  if (iscow) {
    TRef zerop = lj_ir_kintp(J, 0);
    trl = emitir(IRT(IR_BXOR, IRT_IGC), trl, lj_ir_kintpgc(J, SBUF_FLAG_COW));
    recff_sbufx_set_ptr(J, ud, IRFL_SBUF_W, zerop);
    recff_sbufx_set_ptr(J, ud, IRFL_SBUF_E, zerop);
    recff_sbufx_set_ptr(J, ud, IRFL_SBUF_B, zerop);
    recff_sbufx_set_L(J, ud, trl);
    emitir(IRT(IR_FSTORE, IRT_PGC),
	   emitir(IRT(IR_FREF, IRT_PGC), ud, IRFL_SBUF_REF), zeropgc);
    recff_sbufx_set_ptr(J, ud, IRFL_SBUF_R, zerop);
  } else {
    TRef trb = recff_sbufx_get_ptr(J, ud, IRFL_SBUF_B);
    recff_sbufx_set_ptr(J, ud, IRFL_SBUF_W, trb);
    recff_sbufx_set_ptr(J, ud, IRFL_SBUF_R, trb);
  }
}